

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
optCompare_optEmptyNullopt_Test::optCompare_optEmptyNullopt_Test
          (optCompare_optEmptyNullopt_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001c7708;
  return;
}

Assistant:

TEST(optCompare, optEmptyNullopt)
{
  using opt_int = opt<int, opt_null_value_policy<int, -1>>;
  opt_int i;
  EXPECT_TRUE(i == nullopt);
  EXPECT_FALSE(i != nullopt);
  EXPECT_FALSE(i < nullopt);
  EXPECT_FALSE(i > nullopt);
  EXPECT_TRUE(i <= nullopt);
  EXPECT_TRUE(i >= nullopt);
}